

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O3

char * Ptr_AbcObjName(Abc_Obj_t *pObj)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  long lVar4;
  
  uVar1 = *(uint *)&pObj->field_0x14;
  while( true ) {
    uVar2 = uVar1 & 0xf;
    if (((uVar2 == 6) || ((uVar1 & 0xe) == 8)) || (uVar2 == 10)) {
      pcVar3 = Abc_ObjName(pObj);
      return pcVar3;
    }
    if (((7 < uVar2) || (lVar4 = 0x30, (0xa4U >> uVar2 & 1) == 0)) &&
       (lVar4 = 0x20, uVar2 - 5 < 0xfffffffe)) break;
    pObj = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[**(int **)((long)&pObj->pNtk + lVar4)];
    uVar1 = *(uint *)&pObj->field_0x14;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtrAbc.c"
                ,0x66,"char *Ptr_AbcObjName(Abc_Obj_t *)");
}

Assistant:

char * Ptr_AbcObjName( Abc_Obj_t * pObj )
{
    if ( Abc_ObjIsNet(pObj) || Abc_ObjIsBox(pObj) )
        return Abc_ObjName(pObj);
    if ( Abc_ObjIsCi(pObj) || Abc_ObjIsNode(pObj) )
        return Ptr_AbcObjName(Abc_ObjFanout0(pObj));
    if ( Abc_ObjIsCo(pObj) )
        return Ptr_AbcObjName(Abc_ObjFanin0(pObj));
    assert( 0 );
    return NULL;
}